

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

void __thiscall util::TraceThread(util *this,string_view thread_name,function<void_()> thread_func)

{
  undefined8 uVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string_view thread_name_local;
  string local_38;
  long local_18;
  
  pcVar2 = thread_name._M_str;
  thread_name_local._M_str = (char *)thread_name._M_len;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  thread_name_local._M_len = (size_t)this;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,thread_name_local._M_str,this + (long)thread_name_local._M_str);
  ThreadRename(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/thread.cpp"
  ;
  source_file._M_len = 0x5f;
  logging_function._M_str = "TraceThread";
  logging_function._M_len = 0xb;
  LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
            (logging_function,source_file,0x14,ALL,Info,(ConstevalFormatString<1U>)0x112e0b2,
             &thread_name_local);
  if (*(long *)(pcVar2 + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      uVar1 = std::__throw_bad_function_call();
      if ((string_view *)local_38._M_dataplus._M_p != &thread_name_local) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        _Unwind_Resume(uVar1);
      }
    }
  }
  else {
    (**(code **)(pcVar2 + 0x18))(pcVar2);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/thread.cpp"
    ;
    source_file_00._M_len = 0x5f;
    logging_function_00._M_str = "TraceThread";
    logging_function_00._M_len = 0xb;
    LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
              (logging_function_00,source_file_00,0x16,ALL,Info,(ConstevalFormatString<1U>)0x112e0c3
               ,&thread_name_local);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void util::TraceThread(std::string_view thread_name, std::function<void()> thread_func)
{
    util::ThreadRename(std::string{thread_name});
    try {
        LogPrintf("%s thread start\n", thread_name);
        thread_func();
        LogPrintf("%s thread exit\n", thread_name);
    } catch (const std::exception& e) {
        PrintExceptionContinue(&e, thread_name);
        throw;
    } catch (...) {
        PrintExceptionContinue(nullptr, thread_name);
        throw;
    }
}